

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_MappingChannel * __thiscall
ON_ObjectRenderingAttributes::MappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,ON_UUID *mapping_id)

{
  bool bVar1;
  ON_MappingRef *pOVar2;
  int iVar3;
  ON_MappingChannel *b;
  
  pOVar2 = MappingRef(this,plugin_id);
  if ((pOVar2 != (ON_MappingRef *)0x0) && (iVar3 = (pOVar2->m_mapping_channels).m_count, 0 < iVar3))
  {
    b = (pOVar2->m_mapping_channels).m_a;
    do {
      bVar1 = ::operator==(mapping_id,&b->m_mapping_id);
      if (bVar1) {
        return b;
      }
      b = b + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return (ON_MappingChannel *)0x0;
}

Assistant:

const ON_MappingChannel* ON_ObjectRenderingAttributes::MappingChannel(
  const ON_UUID& plugin_id,
  const ON_UUID& mapping_id
  ) const
{
  const ON_MappingRef* mr = MappingRef(plugin_id);
  if ( mr )
  {
    int count;
    if ( (count = mr->m_mapping_channels.Count()) > 0 )
    {
      for ( const ON_MappingChannel* mc = mr->m_mapping_channels.Array(); count--; mc++ )
      {
        if ( mapping_id == mc->m_mapping_id )
          return mc;
      }
    }
  }
  return 0;
}